

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_hang_test.c
# Opt level: O0

int main(void)

{
  signal(0xe,alarm_handler);
  puts("");
  callback_hang_test(3);
  callback_hang_test(4);
  callback_hang_test(2);
  puts("");
  return 0;
}

Assistant:

int
main (void)
{
	/* Set up SIGALRM handler. */
	signal (SIGALRM, alarm_handler) ;

	puts ("") ;
	callback_hang_test (SRC_ZERO_ORDER_HOLD) ;
	callback_hang_test (SRC_LINEAR) ;
#ifdef ENABLE_SINC_FAST_CONVERTER
	callback_hang_test (SRC_SINC_FASTEST) ;
#endif
	puts ("") ;

	return 0 ;
}